

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::AtomicCompSwapCase::ReturnValueVerifier::operator()
          (ReturnValueVerifier *this,TestLog *log,ConstPixelBufferAccess *resultSlice,
          int sliceOrFaceNdx)

{
  ostringstream *this_00;
  ostringstream *this_01;
  deUint32 value;
  int iVar1;
  char *__s;
  MessageBuilder *pMVar2;
  int *piVar3;
  ConstPixelBufferAccess *__n;
  uint y;
  void *__buf;
  Vector<int,_2> (*arr) [5];
  int (*arr_00) [5];
  Vector<int,_3> (*arr_01) [5];
  int (*arr_02) [5];
  int (*arr_03) [5];
  int iVar4;
  long lVar5;
  long lVar6;
  IVec3 *pIVar7;
  int sliceOrFaceNdx_local;
  allocator<char> local_7a1;
  TextureFormat local_7a0;
  int compareArgs [5];
  int local_784;
  ConstPixelBufferAccess *local_780;
  int returnValues [5];
  ChannelOrder CStack_764;
  long local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  IVec3 invocationGlobalIDs [5];
  IVec2 pixelCoords [5];
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  undefined1 local_630 [8];
  ostream local_628;
  IVec3 gid;
  undefined1 local_330 [8];
  ostream local_328;
  undefined1 local_1b0 [384];
  
  sliceOrFaceNdx_local = sliceOrFaceNdx;
  local_7a0 = (TextureFormat)log;
  local_780 = resultSlice;
  de::toString<int>((string *)local_330,&sliceOrFaceNdx_local);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gid,
                 "ReturnValues",(string *)local_330);
  if (this->m_imageType == TEXTURETYPE_CUBE) {
    value = cubeFaceToGLFace((&Functional::(anonymous_namespace)::glslImageFuncZToCubeFace(int)::
                               faces)[sliceOrFaceNdx_local]);
    __s = glu::getCubeMapFaceName(value);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_758,__s,&local_7a1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   invocationGlobalIDs,"face ",&local_758);
  }
  else {
    de::toString<int>(&local_758,&sliceOrFaceNdx_local);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   invocationGlobalIDs,"slice ",&local_758);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                 "Per-Invocation Return Values, ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 invocationGlobalIDs);
  __n = local_780;
  tcu::LogImage::LogImage
            ((LogImage *)local_630,(string *)&gid,(string *)local_1b0,local_780,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_630,local_7a0.order,__buf,(size_t)__n);
  tcu::LogImage::~LogImage((LogImage *)local_630);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)invocationGlobalIDs);
  std::__cxx11::string::~string((string *)&local_758);
  std::__cxx11::string::~string((string *)&gid);
  std::__cxx11::string::~string((string *)local_330);
  lVar5 = 0;
  do {
    local_760 = (long)(local_780->m_size).m_data[1];
    if (local_760 <= lVar5) {
LAB_0125329a:
      return local_760 <= lVar5;
    }
    for (iVar4 = 0; iVar4 < this->m_endResultImageWidth; iVar4 = iVar4 + 1) {
      lVar6 = 0;
      do {
        tcu::Vector<int,_3>::Vector((Vector<int,_3> *)((long)invocationGlobalIDs[0].m_data + lVar6))
        ;
        lVar6 = lVar6 + 0xc;
      } while (lVar6 != 0x3c);
      pixelCoords[4].m_data[0] = 0;
      pixelCoords[4].m_data[1] = 0;
      pixelCoords[2].m_data[0] = 0;
      pixelCoords[2].m_data[1] = 0;
      pixelCoords[3].m_data[0] = 0;
      pixelCoords[3].m_data[1] = 0;
      pixelCoords[0].m_data[0] = 0;
      pixelCoords[0].m_data[1] = 0;
      pixelCoords[1].m_data[0] = 0;
      pixelCoords[1].m_data[1] = 0;
      pIVar7 = invocationGlobalIDs;
      for (lVar6 = -5; lVar6 != 0; lVar6 = lVar6 + 1) {
        y = ((int)lVar6 + 5) * this->m_endResultImageWidth + iVar4;
        gid.m_data[1] = (int)lVar5;
        gid.m_data[0] = y;
        gid.m_data[2] = sliceOrFaceNdx_local;
        (&local_6d0._M_dataplus)[lVar6]._M_p = (pointer)(lVar5 << 0x20 | (ulong)y);
        pIVar7->m_data[2] = sliceOrFaceNdx_local;
        *(undefined8 *)pIVar7->m_data = gid.m_data._0_8_;
        tcu::ConstPixelBufferAccess::getPixelInt
                  ((ConstPixelBufferAccess *)local_630,(int)local_780,y,(int)lVar5);
        (&CStack_764)[lVar6] = local_630._0_4_;
        iVar1 = getCompareArg(&gid,this->m_endResultImageWidth);
        (&local_784)[lVar6] = iVar1;
        pIVar7 = pIVar7 + 1;
      }
      piVar3 = returnValues;
      iVar1 = 0;
      for (lVar6 = 0; lVar6 != -5; lVar6 = lVar6 + -1) {
        if (*piVar3 != compareArgs[iVar1]) {
          if (lVar6 != 0) {
            iVar1 = iVar1 + 1;
            if (*piVar3 == compareArgs[iVar1]) goto LAB_01252e5e;
          }
          local_1b0._0_4_ = local_7a0.order;
          local_1b0._4_4_ = local_7a0.type;
          this_00 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::operator<<((ostream *)this_00,"// Failure: intermediate return values at pixels ");
          arrayStr<tcu::Vector<int,2>,5>(&local_650,(Functional *)pixelCoords,arr);
          this_01 = (ostringstream *)(gid.m_data + 2);
          std::operator<<((ostream *)this_00,(string *)&local_650);
          std::operator<<((ostream *)this_00," of current layer are ");
          arrayStr<int,5>(&local_670,(Functional *)returnValues,arr_00);
          std::operator<<((ostream *)this_00,(string *)&local_670);
          local_330 = (undefined1  [8])
                      tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_1b0,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
          std::operator<<(&local_328,"// Note: relevant shader invocation global IDs are ");
          arrayStr<tcu::Vector<int,3>,5>(&local_690,(Functional *)invocationGlobalIDs,arr_01);
          std::operator<<(&local_328,(string *)&local_690);
          gid.m_data._0_8_ =
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream(this_01);
          std::operator<<((ostream *)this_01,"// Note: \'compare\' argument values for the IDs are "
                         );
          arrayStr<int,5>(&local_6b0,(Functional *)compareArgs,arr_02);
          std::operator<<((ostream *)this_01,(string *)&local_6b0);
          local_630 = (undefined1  [8])
                      tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)&gid,(EndMessageToken *)&tcu::TestLog::EndMessage
                                );
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
          std::operator<<(&local_628,
                          "// Note: expected the return value sequence to fulfill the following conditions:\n"
                         );
          std::operator<<(&local_628,"// - first value is ");
          std::ostream::operator<<(&local_628,compareArgs[0]);
          std::operator<<(&local_628,"\n");
          std::operator<<(&local_628,
                          "// - each value other than the first is either the same as the one just before it, or the smallest value (in the sequence "
                         );
          arrayStr<int,5>(&local_6d0,(Functional *)compareArgs,arr_03);
          std::operator<<(&local_628,(string *)&local_6d0);
          std::operator<<(&local_628,") bigger than the one just before it");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_630,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_6d0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_628);
          std::__cxx11::string::~string((string *)&local_6b0);
          std::__cxx11::ostringstream::~ostringstream(this_01);
          std::__cxx11::string::~string((string *)&local_690);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
          std::__cxx11::string::~string((string *)&local_670);
          std::__cxx11::string::~string((string *)&local_650);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          if (lVar6 == 0) {
            local_630._0_4_ = local_7a0.order;
            local_630._4_4_ = local_7a0.type;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
            std::operator<<(&local_628,"// Note: the first return value (");
            std::ostream::operator<<((ostringstream *)&local_628,returnValues[0]);
            std::operator<<(&local_628,") isn\'t ");
            std::ostream::operator<<((ostringstream *)&local_628,compareArgs[0]);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_630,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
          else {
            local_630._0_4_ = local_7a0.order;
            local_630._4_4_ = local_7a0.type;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
            std::operator<<(&local_628,"// Note: the return value at index ");
            std::ostream::operator<<(&local_628,-(int)lVar6);
            std::operator<<(&local_628," (value ");
            pMVar2 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_630,piVar3);
            std::operator<<(&(pMVar2->m_str).super_basic_ostream<char,_std::char_traits<char>_>,") "
                           );
            std::operator<<(&(pMVar2->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                            "is neither ");
            pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,returnValues + (-(int)lVar6 - 1));
            std::operator<<(&(pMVar2->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                            " (the one just before it) ");
            std::operator<<(&(pMVar2->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                            "nor ");
            piVar3 = std::__find_if<int_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                               (compareArgs,&local_784,returnValues + (-(int)lVar6 - 1));
            pMVar2 = tcu::MessageBuilder::operator<<
                               (pMVar2,compareArgs +
                                       (((long)piVar3 - (long)compareArgs) * 0x40000000 +
                                        0x100000000 >> 0x20));
            std::operator<<(&(pMVar2->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                            " (the smallest value bigger than the one just before it)");
            tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_628);
          goto LAB_0125329a;
        }
LAB_01252e5e:
        piVar3 = piVar3 + 1;
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

bool operator() (TestLog& log, const ConstPixelBufferAccess& resultSlice, int sliceOrFaceNdx) const
	{
		DE_ASSERT(isFormatTypeInteger(resultSlice.getFormat().type));
		DE_ASSERT(resultSlice.getWidth() == NUM_INVOCATIONS_PER_PIXEL*m_endResultImageWidth);

		log << TestLog::Image("ReturnValues" + toString(sliceOrFaceNdx),
							  "Per-Invocation Return Values, "
								   + (m_imageType == TEXTURETYPE_CUBE ? "face " + string(glu::getCubeMapFaceName(cubeFaceToGLFace(glslImageFuncZToCubeFace(sliceOrFaceNdx))))
																	  : "slice " + toString(sliceOrFaceNdx)),
							  resultSlice);

		for (int y = 0; y < resultSlice.getHeight(); y++)
		for (int x = 0; x < m_endResultImageWidth; x++)
		{
			// Get the atomic function args and return values for all the invocations that contribute to the pixel (x, y) in the current end result slice.

			int		returnValues[NUM_INVOCATIONS_PER_PIXEL];
			int		compareArgs[NUM_INVOCATIONS_PER_PIXEL];
			IVec3	invocationGlobalIDs[NUM_INVOCATIONS_PER_PIXEL];
			IVec2	pixelCoords[NUM_INVOCATIONS_PER_PIXEL];

			for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
			{
				const IVec2 pixCoord	(x + i*m_endResultImageWidth, y);
				const IVec3 gid			(pixCoord.x(), pixCoord.y(), sliceOrFaceNdx);

				pixelCoords[i]			= pixCoord;
				invocationGlobalIDs[i]	= gid;
				returnValues[i]			= resultSlice.getPixelInt(gid.x(), y).x();
				compareArgs[i]			= getCompareArg(gid, m_endResultImageWidth);
			}

			// Verify that the return values form a valid sequence.
			// Due to the way the compare and assign arguments to the atomic calls are organized
			// among the different invocations contributing to the same pixel -- i.e. one invocation
			// compares to A and assigns B, another compares to B and assigns C, and so on, where
			// A<B<C etc -- the first value in the return value sequence must be A, and each following
			// value must be either the same as or the smallest value (among A, B, C, ...) bigger than
			// the one just before it. E.g. sequences A A A A A A A A, A B C D E F G H and
			// A A B B B C D E are all valid sequences (if there were 8 invocations contributing
			// to each pixel).

			{
				int failingNdx = -1;

				{
					int currentAtomicValueNdx = 0;
					for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
					{
						if (returnValues[i] == compareArgs[currentAtomicValueNdx])
							continue;
						if (i > 0 && returnValues[i] == compareArgs[currentAtomicValueNdx+1])
						{
							currentAtomicValueNdx++;
							continue;
						}
						failingNdx = i;
						break;
					}
				}

				if (failingNdx >= 0)
				{
					log << TestLog::Message << "// Failure: intermediate return values at pixels " << arrayStr(pixelCoords) << " of current layer are "
											<< arrayStr(returnValues) << TestLog::EndMessage
						<< TestLog::Message << "// Note: relevant shader invocation global IDs are " << arrayStr(invocationGlobalIDs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: 'compare' argument values for the IDs are " << arrayStr(compareArgs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: expected the return value sequence to fulfill the following conditions:\n"
											<< "// - first value is " << compareArgs[0] << "\n"
											<< "// - each value other than the first is either the same as the one just before it, or the smallest value (in the sequence "
											<< arrayStr(compareArgs) << ") bigger than the one just before it" << TestLog::EndMessage;
					if (failingNdx == 0)
						log << TestLog::Message << "// Note: the first return value (" << returnValues[0] << ") isn't " << compareArgs[0] << TestLog::EndMessage;
					else
						log << TestLog::Message << "// Note: the return value at index " << failingNdx << " (value " << returnValues[failingNdx] << ") "
												<< "is neither " << returnValues[failingNdx-1] << " (the one just before it) "
												<< "nor " << compareArgs[arrayIndexOf(compareArgs, returnValues[failingNdx-1])+1] << " (the smallest value bigger than the one just before it)"
												<< TestLog::EndMessage;

					return false;
				}
			}
		}

		return true;
	}